

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Publication.h
# Opt level: O0

int64_t __thiscall
aeron::Publication::newPosition
          (Publication *this,int32_t termCount,int32_t termOffset,int32_t termId,int64_t position,
          int32_t resultingOffset)

{
  int32_t resultingOffset_local;
  int64_t position_local;
  int32_t termId_local;
  int32_t termOffset_local;
  int32_t termCount_local;
  Publication *this_local;
  
  if (resultingOffset < 1) {
    if (this->m_maxPossiblePosition < position + termOffset) {
      this_local = (Publication *)0xfffffffffffffffb;
    }
    else {
      concurrent::logbuffer::LogBufferDescriptor::rotateLog
                (this->m_logMetaDataBuffer,termCount,termId);
      this_local = (Publication *)0xfffffffffffffffd;
    }
  }
  else {
    this_local = (Publication *)((position - termOffset) + (long)resultingOffset);
  }
  return (int64_t)this_local;
}

Assistant:

inline std::int64_t newPosition(
        std::int32_t termCount,
        std::int32_t termOffset,
        std::int32_t termId,
        std::int64_t position,
        std::int32_t resultingOffset)
    {
        if (resultingOffset > 0)
        {
            return (position - termOffset) + resultingOffset;
        }

        if ((position + termOffset) > m_maxPossiblePosition)
        {
            return MAX_POSITION_EXCEEDED;
        }

        LogBufferDescriptor::rotateLog(m_logMetaDataBuffer, termCount, termId);

        return ADMIN_ACTION;
    }